

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eco_dns.cpp
# Opt level: O3

eco_ip_t eco::eco_dns_query(char *domain,char **ip)

{
  int iVar1;
  eco_ip_t eVar2;
  
  *ip = (char *)0x0;
  eVar2 = ECO_IPV4;
  iVar1 = eco_internal_dns_query(domain,ip,ECO_QR_V4);
  if (iVar1 != 0) {
    iVar1 = eco_internal_dns_query(domain,ip,ECO_QR_V6);
    eVar2 = (uint)(iVar1 == 0) * 2;
  }
  return eVar2;
}

Assistant:

eco_ip_t eco::eco_dns_query(const char* domain, char **ip)
{

  *ip = nullptr;

  if (!eco_internal_dns_query(domain, ip, ECO_QR_V4))
    return ECO_IPV4;

  if (!eco_internal_dns_query(domain, ip, ECO_QR_V6))
    return ECO_IPV6;

  return ECO_FAIL;

}